

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void Catch::recursivelyWrapLine(ostream *os,string *paragraph,size_t columns,size_t indent)

{
  ostream *poVar1;
  ulong uVar2;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar3 = 0;
  do {
    uVar2 = uVar3;
    while( true ) {
      if (paragraph->_M_string_length <= uVar2) {
        addIndent(os,indent);
        poVar1 = std::operator<<(os,(string *)paragraph);
        std::operator<<(poVar1,"\n");
        return;
      }
      if (columns - indent == uVar2) {
        addIndent(os,indent);
        std::__cxx11::string::substr((ulong)&local_90,(ulong)paragraph);
        poVar1 = std::operator<<(os,(string *)&local_90);
        std::operator<<(poVar1,"\n");
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::substr((ulong)&local_70,(ulong)paragraph);
        recursivelyWrapLine(os,&local_70,columns,uVar3 + indent);
        std::__cxx11::string::~string((string *)&local_70);
        return;
      }
      if ((paragraph->_M_dataplus)._M_p[uVar2] == '\t') break;
      uVar2 = uVar2 + 1;
    }
    std::__cxx11::string::substr((ulong)&local_b0,(ulong)paragraph);
    std::__cxx11::string::substr((ulong)&local_50,(ulong)paragraph);
    std::operator+(&local_90,&local_b0,&local_50);
    std::__cxx11::string::operator=((string *)paragraph,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_b0);
    uVar3 = uVar2;
  } while( true );
}

Assistant:

inline void recursivelyWrapLine( std::ostream& os, std::string paragraph, std::size_t columns, std::size_t indent ) {
        std::size_t width = columns-indent;
        std::size_t tab = 0;
        std::size_t wrapPoint = width;
        for( std::size_t pos = 0; pos < paragraph.size(); ++pos ) {
            if( pos == width ) {
                addIndent( os, indent );
                os << paragraph.substr( 0, wrapPoint ) << "\n";
                return recursivelyWrapLine( os, paragraph.substr( wrapPoint+1 ), columns, indent+tab );
            }
            if( paragraph[pos] == '\t' ) {
                    tab = pos;
                    paragraph = paragraph.substr( 0, tab ) + paragraph.substr( tab+1 );
                    pos--;
            }
            else if( paragraph[pos] == ' ' ) {
                wrapPoint = pos;
            }
        }
        addIndent( os, indent );
        os << paragraph << "\n";
    }